

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncodingHandlerPtr xmlFindCharEncodingHandler(char *name)

{
  int iVar1;
  xmlCharEncodingHandler *in_RAX;
  xmlCharEncodingHandler *pxVar2;
  xmlCharEncodingHandler *ret;
  xmlCharEncodingHandler *local_18;
  
  local_18 = in_RAX;
  iVar1 = xmlStrcasecmp((xmlChar *)name,"UTF-8");
  pxVar2 = defaultHandlers + 1;
  if (iVar1 != 0) {
    iVar1 = xmlStrcasecmp((xmlChar *)name,(xmlChar *)"UTF8");
    if (iVar1 != 0) {
      xmlOpenCharEncodingHandler(name,0,&local_18);
      pxVar2 = local_18;
    }
  }
  return pxVar2;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlFindCharEncodingHandler(const char *name) {
    xmlCharEncodingHandler *ret;

    /*
     * This handler shouldn't be used, but we must return a non-NULL
     * handler.
     */
    if ((xmlStrcasecmp(BAD_CAST name, BAD_CAST "UTF-8") == 0) ||
        (xmlStrcasecmp(BAD_CAST name, BAD_CAST "UTF8") == 0))
        return((xmlCharEncodingHandlerPtr)
                &defaultHandlers[XML_CHAR_ENCODING_UTF8]);

    xmlOpenCharEncodingHandler(name, 0, &ret);
    return(ret);
}